

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_serializer.cpp
# Opt level: O1

void __thiscall duckdb::BinarySerializer::WriteValue(BinarySerializer *this,char *value)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  size_t val;
  ulong uVar4;
  long lVar5;
  uint8_t buffer [16];
  byte local_28 [16];
  
  val = strlen(value);
  uVar2 = NumericCastImpl<unsigned_int,_unsigned_long,_false>::Convert(val);
  local_28[0] = 0;
  local_28[1] = 0;
  local_28[2] = 0;
  local_28[3] = 0;
  local_28[4] = 0;
  local_28[5] = 0;
  local_28[6] = 0;
  local_28[7] = 0;
  local_28[8] = 0;
  local_28[9] = 0;
  local_28[10] = 0;
  local_28[0xb] = 0;
  local_28[0xc] = 0;
  local_28[0xd] = 0;
  local_28[0xe] = 0;
  local_28[0xf] = 0;
  lVar5 = 0;
  uVar4 = (ulong)uVar2;
  uVar3 = uVar2;
  do {
    uVar4 = uVar4 >> 7;
    local_28[lVar5] = (0x7f < uVar3) << 7 | (byte)uVar3 & 0x7f;
    lVar5 = lVar5 + 1;
    bVar1 = 0x7f < uVar3;
    uVar3 = (uint)uVar4;
  } while (bVar1);
  (**this->stream->_vptr_WriteStream)(this->stream,local_28);
  (**this->stream->_vptr_WriteStream)(this->stream,value,(ulong)uVar2);
  return;
}

Assistant:

void BinarySerializer::WriteValue(const char *value) {
	auto len = NumericCast<uint32_t>(strlen(value));
	VarIntEncode(len);
	WriteData(value, len);
}